

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getAlpha(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  undefined8 local_100;
  EAMAdapter *in_stack_ffffffffffffffa8;
  
  getZhouParam(in_stack_ffffffffffffffa8);
  ZhouParameters::~ZhouParameters(local_100);
  return (RealType)local_100;
}

Assistant:

RealType EAMAdapter::getAlpha() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.alpha;
  }